

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tcv.c
# Opt level: O3

int tcv_destroy(tcv_t *tcv)

{
  pthread_mutex_t *__mutex;
  int iVar1;
  int iVar2;
  
  iVar2 = -4;
  if ((tcv != (tcv_t *)0x0) && (tcv->created == true)) {
    __mutex = &tcv->lock;
    iVar1 = pthread_mutex_lock((pthread_mutex_t *)__mutex);
    if (iVar1 == 0) {
      if (tcv->data != (void *)0x0) {
        free(tcv->data);
        tcv->data = (void *)0x0;
        tcv->created = false;
      }
      pthread_mutex_unlock((pthread_mutex_t *)__mutex);
      pthread_mutex_destroy((pthread_mutex_t *)__mutex);
      free(tcv);
      iVar2 = 0;
    }
  }
  return iVar2;
}

Assistant:

int tcv_destroy(tcv_t *tcv)
{
	int ret = 0;

	if (!tcv_check_and_lock_ok(tcv))
		return TCV_ERR_INVALID_ARG;

	if (tcv->data) {
		free(tcv->data);
		tcv->data = NULL;
		tcv->created = false;
	}
	tcv_unlock(tcv);
	pthread_mutex_destroy(&tcv->lock);
	free(tcv);

	return ret;
}